

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

void bool2int(BoolView *x,IntVar *y)

{
  int iVar1;
  BoolView local_50;
  BoolView local_40;
  BoolView local_30;
  
  int_rel(y,IRT_GE,0);
  int_rel(y,IRT_LE,1);
  IntVar::specialiseToEL(y);
  local_30.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
  local_30.v = x->v;
  local_30.s = x->s;
  iVar1 = (*(y->super_Var).super_Branching._vptr_Branching[0xd])(y,1,2);
  local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
  local_40.v = iVar1 >> 1;
  local_40.s = (bool)((byte)iVar1 & 1);
  local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
  local_50.v = bv_true.v;
  local_50.s = bv_true.s;
  bool_rel(&local_30,BRT_EQ,&local_40,&local_50);
  return;
}

Assistant:

void bool2int(BoolView x, IntVar* y) {
	int_rel(y, IRT_GE, 0);
	int_rel(y, IRT_LE, 1);
	y->specialiseToEL();
	bool_rel(std::move(x), BRT_EQ, BoolView(y->getLit(1, LR_GE)));
}